

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

void __thiscall QWidget::setGraphicsEffect(QWidget *this,QGraphicsEffect *effect)

{
  QWidgetPrivate *this_00;
  QWidgetData *pQVar1;
  long lVar2;
  undefined1 auVar3 [16];
  QWidgetEffectSourcePrivate *this_01;
  QGraphicsEffectSource *this_02;
  long in_FS_OFFSET;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidgetPrivate **)&this->field_0x8;
  if (this_00->graphicsEffect != effect) {
    if (this_00->graphicsEffect != (QGraphicsEffect *)0x0) {
      pQVar1 = this->data;
      local_48.x2.m_i = (pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i;
      local_48.y2.m_i = (pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i;
      local_48.x1.m_i = 0;
      local_48.y1.m_i = 0;
      QWidgetPrivate::invalidateBackingStore<QRect>(this_00,&local_48);
      if (this_00->graphicsEffect != (QGraphicsEffect *)0x0) {
        (**(code **)(*(long *)this_00->graphicsEffect + 0x20))();
      }
      this_00->graphicsEffect = (QGraphicsEffect *)0x0;
    }
    if (effect != (QGraphicsEffect *)0x0) {
      this_01 = (QWidgetEffectSourcePrivate *)operator_new(0xf8);
      QWidgetEffectSourcePrivate::QWidgetEffectSourcePrivate(this_01,this);
      this_02 = (QGraphicsEffectSource *)operator_new(0x10);
      QGraphicsEffectSource::QGraphicsEffectSource
                (this_02,(QGraphicsEffectSourcePrivate *)this_01,(QObject *)0x0);
      this_00->graphicsEffect = effect;
      lVar2 = *(long *)&effect->field_0x8;
      if (*(long *)(lVar2 + 0x78) != 0) {
        (**(code **)(**(long **)(*(long *)(lVar2 + 0x78) + 8) + 0x70))();
        QGraphicsEffectSourcePrivate::invalidateCache
                  (*(QGraphicsEffectSourcePrivate **)(*(long *)(lVar2 + 0x78) + 8),SourceChanged);
        (**(code **)(**(long **)(*(long *)(lVar2 + 0x78) + 8) + 0x20))();
        if (*(long **)(lVar2 + 0x78) != (long *)0x0) {
          (**(code **)(**(long **)(lVar2 + 0x78) + 0x20))();
        }
      }
      *(QGraphicsEffectSource **)(lVar2 + 0x78) = this_02;
      (**(code **)(**(long **)(lVar2 + 8) + 0x70))();
      pQVar1 = this->data;
      auVar3._4_4_ = (pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i;
      auVar3._0_4_ = (pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i;
      auVar3._8_8_ = 0;
      QWidgetPrivate::update<QRect>(*(QWidgetPrivate **)&this->field_0x8,(QRect)(auVar3 << 0x40));
    }
    QWidgetPrivate::updateIsOpaque(this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidget::setGraphicsEffect(QGraphicsEffect *effect)
{
    Q_D(QWidget);
    if (d->graphicsEffect == effect)
        return;

    if (d->graphicsEffect) {
        d->invalidateBackingStore(rect());
        delete d->graphicsEffect;
        d->graphicsEffect = nullptr;
    }

    if (effect) {
        // Set new effect.
        QGraphicsEffectSourcePrivate *sourced = new QWidgetEffectSourcePrivate(this);
        QGraphicsEffectSource *source = new QGraphicsEffectSource(*sourced);
        d->graphicsEffect = effect;
        effect->d_func()->setGraphicsEffectSource(source);
        update();
    }

    d->updateIsOpaque();
}